

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall
ON_Brep::IsValidLoopTolerancesAndFlags(ON_Brep *this,int loop_index,ON_TextLog *text_log)

{
  ON_BrepLoop *pOVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = (ulong)(uint)loop_index;
  if (loop_index < 0 ||
      (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
      loop_index) {
    if (text_log == (ON_TextLog *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      ON_TextLog::Print(text_log,"brep loop_index = %d (should be >=0 and <%d=brep.m_L.Count() ).\n"
                        ,uVar2);
    }
  }
  else {
    pOVar1 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    bVar3 = pOVar1[uVar2].m_loop_index == loop_index;
    if (text_log != (ON_TextLog *)0x0 && !bVar3) {
      bVar3 = false;
      ON_TextLog::Print(text_log,"brep.m_L[%d] loop is not valid.\n",uVar2);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"loop.m_loop_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar1[uVar2].m_loop_index,uVar2);
      ON_TextLog::PopIndent(text_log);
    }
  }
  return bVar3;
}

Assistant:

bool
ON_Brep::IsValidLoopTolerancesAndFlags( int loop_index, ON_TextLog* text_log ) const
{
  if ( loop_index < 0 || loop_index >= m_L.Count() )
  {
    if ( text_log )
      text_log->Print("brep loop_index = %d (should be >=0 and <%d=brep.m_L.Count() ).\n",
                      loop_index, m_L.Count());
    return false;
  }
  const ON_BrepLoop& loop = m_L[loop_index];
  if ( loop.m_loop_index != loop_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_L[%d] loop is not valid.\n",loop_index);
      text_log->PushIndent();
      text_log->Print("loop.m_loop_index = %d (should be %d).\n",
                       loop.m_loop_index, loop_index );
      text_log->PopIndent();
    }
    return false;
  }
  return true;
}